

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O3

int __thiscall ktx::Tools::main(Tools *this,int argc,char **argv)

{
  uint uVar1;
  OptionAdder *pOVar2;
  OptionValue *this_00;
  bool *pbVar3;
  size_t sVar4;
  uint *puVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 testrun;
  int iVar6;
  Tools *pTVar7;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  string_view fmt;
  format_args args_04;
  ParseResult args;
  Options options;
  undefined1 local_53d;
  int local_53c;
  uint *local_538;
  pointer local_530;
  uint local_528;
  undefined4 uStack_524;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  shared_ptr<const_cxxopts::Value> local_498;
  shared_ptr<const_cxxopts::Value> local_488;
  shared_ptr<const_cxxopts::Value> local_478;
  Tools *local_460;
  string local_458;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 auStack_418 [16];
  _Alloc_hider local_408;
  pointer pKStack_400;
  undefined1 local_3f8 [16];
  _Alloc_hider local_3e8;
  __node_base local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3d8;
  _Alloc_hider local_3c8;
  __node_base_ptr p_Stack_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  __node_base local_3a8;
  size_type sStack_3a0;
  _Prime_rehash_policy local_398;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_388;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  undefined1 local_300 [20];
  undefined4 uStack_2ec;
  undefined8 uStack_2e8;
  _Prime_rehash_policy local_2e0;
  __node_base_ptr p_Stack_2d0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2c8;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_290;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> vStack_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  long *local_230 [2];
  long local_220 [2];
  undefined1 local_210 [56];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1d8;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_1a0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  undefined1 local_158 [129];
  bool local_d7;
  size_t local_d0;
  Options *local_c0;
  char local_b0 [128];
  
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"ktx","");
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"");
  cxxopts::Options::Options((Options *)local_158,&local_320,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_53c = argc;
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"[<command>] [OPTION...]","");
  std::__cxx11::string::operator=((string *)(local_158 + 0x40),(string *)local_230);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  local_d0 = 100;
  local_538 = &local_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"");
  uVar1 = local_528;
  local_428._0_8_ = local_530;
  puVar5 = (uint *)(local_300 + 0x10);
  if (local_538 != &local_528) {
    puVar5 = local_538;
  }
  uStack_2ec = uStack_524;
  local_300._16_4_ = local_528;
  local_530 = (pointer)0x0;
  local_528 = local_528 & 0xffffff00;
  local_438._8_8_ = local_428 + 8;
  if (puVar5 == (uint *)(local_300 + 0x10)) {
    local_428._8_8_ = CONCAT44(uStack_524,uVar1);
  }
  else {
    local_428._8_8_ = stack0xfffffffffffffd10;
    local_438._8_8_ = puVar5;
  }
  local_300._0_8_ = local_300 + 0x10;
  local_538 = &local_528;
  local_438._0_8_ = (Options *)local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"h,help","");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"Print this usage message and exit","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_518,(allocator<cxxopts::values::standard_value<bool>_> *)&local_4f8);
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_518._M_dataplus._M_p._0_4_;
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_518._M_dataplus._M_p._4_4_;
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_518._M_string_length;
  local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_518._M_string_length._4_4_;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
  pOVar2 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_438,(string *)local_300,(string *)local_210,&local_478,
                      &local_4b8);
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"v,version","");
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,"Print the version number of this program and exit","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_4d8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_458);
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_4d8._M_dataplus._M_p._0_4_;
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_4d8._M_dataplus._M_p._4_4_;
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_4d8._M_string_length;
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_4d8._M_string_length._4_4_;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"");
  local_460 = this;
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_518,&local_4f8,&local_488,&local_360);
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"testrun","");
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_458,
             "Indicates test run. If enabled the tool will produce deterministic output whenever possible"
             ,"");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_248,(allocator<cxxopts::values::standard_value<bool>_> *)&local_53d);
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_248;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_244;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_240;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_23c;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"");
  cxxopts::OptionAdder::operator()(pOVar2,&local_4d8,&local_458,&local_498,&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_498.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_498.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_488.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_488.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_478.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_478.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_478.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
    operator_delete((void *)local_300._0_8_,stack0xfffffffffffffd10 + 1);
  }
  if ((undefined1 *)local_438._8_8_ != local_428 + 8) {
    operator_delete((void *)local_438._8_8_,local_428._8_8_ + 1);
  }
  iVar6 = local_53c;
  if (local_538 != &local_528) {
    operator_delete(local_538,CONCAT44(uStack_524,local_528) + 1);
  }
  local_438._8_8_ = local_b0;
  local_d7 = true;
  local_300._0_8_ = &p_Stack_2d0;
  local_300._8_8_ = 1;
  stack0xfffffffffffffd10 = 0;
  uStack_2e8 = 0;
  local_2e0._M_max_load_factor = 1.0;
  local_2e0._4_4_ = 0;
  local_2c8._M_buckets = &local_2c8._M_single_bucket;
  local_2e0._M_next_resize = 0;
  p_Stack_2d0 = (__node_base_ptr)0x0;
  local_2c8._M_bucket_count = 1;
  local_2c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2c8._M_element_count = 0;
  local_2c8._M_rehash_policy._M_max_load_factor = 1.0;
  local_2c8._M_rehash_policy._4_4_ = 0;
  local_2c8._M_rehash_policy._M_next_resize = 0;
  local_2c8._M_single_bucket = (__node_base_ptr)0x0;
  local_290.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_278.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_278.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_278.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8._8_8_ = &p_Stack_3c0;
  local_438._0_8_ = local_c0;
  local_428._0_8_ = (pointer)0x0;
  local_428._8_8_ = 0;
  auStack_418._0_8_ = 0;
  auStack_418._8_8_ = (pointer)0x0;
  local_408._M_p = (pointer)0x0;
  pKStack_400 = (pointer)0x0;
  local_3f8[0] = true;
  local_3e8._M_p = (pointer)0x1;
  local_3e0._M_nxt = (_Hash_node_base *)0x0;
  aStack_3d8._M_allocated_capacity = 0;
  aStack_3d8._8_8_ = 0x3f800000;
  local_3b8._M_allocated_capacity = (size_type)&_Stack_388;
  local_3c8._M_p = (pointer)0x0;
  p_Stack_3c0 = (__node_base_ptr)0x0;
  local_3b8._8_8_ = 1;
  local_3a8._M_nxt = (_Hash_node_base *)0x0;
  sStack_3a0 = 0;
  local_398._M_max_load_factor = 1.0;
  local_398._4_4_ = 0;
  local_398._M_next_resize = 0;
  _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cxxopts::OptionParser::parse((ParseResult *)local_210,(OptionParser *)local_438,iVar6,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_3b8);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_3f8 + 8));
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)(auStack_418 + 8));
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_428);
  cxxopts::ParseResult::operator=((ParseResult *)local_300,(ParseResult *)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_188);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_1a0);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1d8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_210);
  local_438._0_8_ = (Options *)local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"testrun","");
  this_00 = cxxopts::ParseResult::operator[]((ParseResult *)local_300,(string *)local_438);
  pTVar7 = local_460;
  pbVar3 = cxxopts::OptionValue::as<bool>(this_00);
  pTVar7->testrun = *pbVar3;
  if ((Options *)local_438._0_8_ != (Options *)local_428) {
    operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
  }
  local_438._0_8_ = (Options *)local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"help","");
  sVar4 = cxxopts::ParseResult::count((ParseResult *)local_300,(string *)local_438);
  if ((Options *)local_438._0_8_ != (Options *)local_428) {
    operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
  }
  if (sVar4 == 0) {
    local_438._0_8_ = (Options *)local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"version","");
    sVar4 = cxxopts::ParseResult::count((ParseResult *)local_300,(string *)local_438);
    testrun = extraout_DL;
    if ((Options *)local_438._0_8_ != (Options *)local_428) {
      operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
      testrun = extraout_DL_00;
    }
    if (sVar4 == 0) {
      if (local_260.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_260.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_438._0_8_ = local_158._0_8_;
        local_438._8_8_ = local_158._8_8_;
        pTVar7 = (Tools *)&std::cerr;
        format_str_01.size_ = 0x15;
        format_str_01.data_ = "{}: Missing command.\n";
        args_02.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_438;
        args_02.desc_ = 0xd;
        ::fmt::v10::vprint<char>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_01,args_02)
        ;
      }
      else {
        local_428._0_8_ = argv[1];
        if (*(char *)&(((pointer)local_428._0_8_)->m_key)._M_dataplus._M_p == '-') {
          local_428._0_8_ =
               ((local_260.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          local_428._8_8_ =
               (local_260.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          local_438._0_8_ = local_158._0_8_;
          local_438._8_8_ = local_158._8_8_;
          pTVar7 = (Tools *)&std::cerr;
          format_str_00.size_ = 0x20;
          format_str_00.data_ = "{}: Unrecognized argument: \"{}\"\n";
          args_01.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_438;
          args_01.desc_ = 0xdd;
          ::fmt::v10::vprint<char>
                    ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_00,
                     args_01);
        }
        else {
          local_438._0_8_ = local_158._0_8_;
          local_438._8_8_ = local_158._8_8_;
          pTVar7 = (Tools *)&std::cerr;
          format_str_02.size_ = 0x1f;
          format_str_02.data_ = "{}: Unrecognized command: \"{}\"\n";
          args_03.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_438;
          args_03.desc_ = 0xcd;
          ::fmt::v10::vprint<char>
                    ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,format_str_02,
                     args_03);
        }
      }
      iVar6 = 1;
      printUsage(pTVar7,(ostream *)&std::cerr,(Options *)local_158);
    }
    else {
      version_abi_cxx11_((string *)local_210,(ktx *)(ulong)pTVar7->testrun,(bool)testrun);
      local_438._0_8_ = local_158._0_8_;
      local_438._8_8_ = local_158._8_8_;
      local_428._0_8_ = local_210._0_8_;
      local_428._8_8_ = local_210._8_8_;
      fmt.size_ = 0xf;
      fmt.data_ = "{} version: {}\n";
      args_04.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_438;
      args_04.desc_ = 0xdd;
      ::fmt::v10::vprint(fmt,args_04);
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      iVar6 = 0;
    }
  }
  else {
    local_438._0_8_ = local_158._0_8_;
    local_438._8_8_ = local_158._8_8_;
    pTVar7 = (Tools *)&std::cout;
    format_str.size_ = 0x61;
    format_str.data_ =
         "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n"
    ;
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_438;
    args_00.desc_ = 0xd;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str,args_00);
    iVar6 = 0;
    printUsage(pTVar7,(ostream *)&std::cout,(Options *)local_158);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&vStack_278);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_290);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2c8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_300);
  cxxopts::Options::~Options((Options *)local_158);
  return iVar6;
}

Assistant:

int Tools::main(int argc, char* argv[]) {
    cxxopts::Options options("ktx", "");
    options.custom_help("[<command>] [OPTION...]");
    options.set_width(CONSOLE_USAGE_WIDTH);
    options.add_options()
            ("h,help", "Print this usage message and exit")
            ("v,version", "Print the version number of this program and exit")
            ("testrun", "Indicates test run. If enabled the tool will produce deterministic output whenever possible");

    options.allow_unrecognised_options();

    cxxopts::ParseResult args;
    try {
        args = options.parse(argc, argv);
    } catch (const std::exception& ex) {
        fmt::print(std::cerr, "{}: {}\n", options.program(), ex.what());
        printUsage(std::cerr, options);
        return +rc::INVALID_ARGUMENTS;
    }

    testrun = args["testrun"].as<bool>();

    if (args.count("help")) {
        fmt::print(std::cout, "{}: Unified CLI frontend for the KTX-Software library with sub-commands for specific operations.\n", options.program());
        printUsage(std::cout, options);
        return +rc::SUCCESS;
    }

    if (args.count("version")) {
        fmt::print("{} version: {}\n", options.program(), version(testrun));
        return +rc::SUCCESS;
    }

    if (args.unmatched().empty()) {
        fmt::print(std::cerr, "{}: Missing command.\n", options.program());
        printUsage(std::cerr, options);
    } else {
        if (argv[1][0] != '-') {
            fmt::print(std::cerr, "{}: Unrecognized command: \"{}\"\n", options.program(), argv[1]);
        } else {
            fmt::print(std::cerr, "{}: Unrecognized argument: \"{}\"\n", options.program(), args.unmatched()[0]);
        }
        printUsage(std::cerr, options);
    }

    return +rc::INVALID_ARGUMENTS;
}